

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O3

void __thiscall chrono::ChSharedMassBody::ArchiveIN(ChSharedMassBody *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChSharedMassBody>(marchive);
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  this->inv_mass = 1.0 / this->mass;
  return;
}

Assistant:

void ChSharedMassBody::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChSharedMassBody>();

    // stream in all member data:
    marchive >> CHNVP(mass);
    ////marchive >> CHNVP(inertia);
    SetBodyMass(mass);
    ////SetBodyInertia(inertia);
}